

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall
Assimp::FBXExporter::WriteAnimationCurveNode
          (FBXExporter *this,StreamWriterLE *outstream,int64_t uid,string *name,
          aiVector3D default_value,string *property_name,int64_t layer_uid,int64_t node_uid)

{
  string *value;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1b0 [8];
  Node p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  Node n;
  int64_t layer_uid_local;
  string *property_name_local;
  string *name_local;
  int64_t uid_local;
  StreamWriterLE *outstream_local;
  FBXExporter *this_local;
  float local_20;
  undefined8 local_18;
  aiVector3D default_value_local;
  
  local_20 = default_value.z;
  this_local = default_value._0_8_;
  n.property_start = layer_uid;
  name_local = (string *)uid;
  uid_local = (int64_t)outstream;
  outstream_local = (StreamWriterLE *)this;
  local_18 = this_local;
  default_value_local.x = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"AnimationCurveNode",&local_e9);
  FBX::Node::Node((Node *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  value = name_local;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &p.property_start,name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FBX::SEPARATOR_abi_cxx11_);
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &p.property_start,"AnimCurveNode");
  FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
            ((Node *)local_c8,(long)value,&local_120,"");
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&p.property_start);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Properties70",&local_1d1)
  ;
  FBX::Node::Node((Node *)local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"d|X",&local_1f9);
  FBX::Node::AddP70numberA((Node *)local_1b0,&local_1f8,(double)(float)local_18);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"d|Y",&local_221);
  FBX::Node::AddP70numberA((Node *)local_1b0,&local_220,(double)local_18._4_4_);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"d|Z",&local_249);
  FBX::Node::AddP70numberA((Node *)local_1b0,&local_248,(double)default_value_local.x);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  FBX::Node::AddChild((Node *)local_c8,(Node *)local_1b0);
  FBX::Node::Dump((Node *)local_c8,(StreamWriterLE *)uid_local,(bool)(this->binary & 1),1);
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0xbab3fd,(char (*) [3])"OO",(long *)&name_local,(long *)&n.property_start
            );
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&,std::__cxx11::string&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0xbab3fd,(char (*) [3])"OP",(long *)&name_local,&node_uid,property_name);
  FBX::Node::~Node((Node *)local_1b0);
  FBX::Node::~Node((Node *)local_c8);
  return;
}

Assistant:

void FBXExporter::WriteAnimationCurveNode(
    StreamWriterLE& outstream,
    int64_t uid,
    const std::string& name, // "T", "R", or "S"
    aiVector3D default_value,
    std::string property_name, // "Lcl Translation" etc
    int64_t layer_uid,
    int64_t node_uid
) {
    FBX::Node n("AnimationCurveNode");
    n.AddProperties(uid, name + FBX::SEPARATOR + "AnimCurveNode", "");
    FBX::Node p("Properties70");
    p.AddP70numberA("d|X", default_value.x);
    p.AddP70numberA("d|Y", default_value.y);
    p.AddP70numberA("d|Z", default_value.z);
    n.AddChild(p);
    n.Dump(outstream, binary, 1);
    // connect to layer
    this->connections.emplace_back("C", "OO", uid, layer_uid);
    // connect to bone
    this->connections.emplace_back("C", "OP", uid, node_uid, property_name);
}